

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall
Privkey_ConvertWif_testnet_compressed_Test::~Privkey_ConvertWif_testnet_compressed_Test
          (Privkey_ConvertWif_testnet_compressed_Test *this)

{
  Privkey_ConvertWif_testnet_compressed_Test *this_local;
  
  ~Privkey_ConvertWif_testnet_compressed_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Privkey, ConvertWif_testnet_compressed) {
  std::string hex =
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27";
  Privkey privkey(hex);
  std::string wif = privkey.ConvertWif(NetType::kTestnet, true);
  EXPECT_STREQ(wif.c_str(),
               "cPCirFtGH3KUJ4ZusGdRUiW5iL3Y2PEM9gxSMRM3YSG6Eon9heJj");
}